

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nfrs.cpp
# Opt level: O1

void __thiscall icu_63::NFRuleSet::~NFRuleSet(NFRuleSet *this)

{
  NFRule *this_00;
  void *in_RSI;
  int i;
  long lVar1;
  
  lVar1 = 0;
  do {
    if (((int)lVar1 - 4U < 0xfffffffd) &&
       (this_00 = this->nonNumericalRules[lVar1], this_00 != (NFRule *)0x0)) {
      NFRule::~NFRule(this_00);
      UMemory::operator_delete((UMemory *)this_00,in_RSI);
    }
    lVar1 = lVar1 + 1;
  } while (lVar1 != 6);
  NFRuleList::~NFRuleList(&this->fractionRules);
  NFRuleList::~NFRuleList(&this->rules);
  UnicodeString::~UnicodeString(&this->name);
  return;
}

Assistant:

NFRuleSet::~NFRuleSet()
{
    for (int i = 0; i < NON_NUMERICAL_RULE_LENGTH; i++) {
        if (i != IMPROPER_FRACTION_RULE_INDEX
            && i != PROPER_FRACTION_RULE_INDEX
            && i != MASTER_RULE_INDEX)
        {
            delete nonNumericalRules[i];
        }
        // else it will be deleted via NFRuleList fractionRules
    }
}